

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syrk.hpp
# Opt level: O0

void remora::bindings::
     syrk_impl<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2,undefined8 *param_3)

{
  int iVar1;
  matrix<double,_remora::row_major,_remora::cpu_tag> *pmVar2;
  unsigned_long *puVar3;
  long lVar4;
  size_t j0_1;
  size_t end_j0;
  size_t start_j0;
  size_t i0_1;
  double *M_diagonal;
  size_t j0;
  size_t i0;
  type E_rights_trans;
  type E_rights;
  size_t mc2;
  size_t j;
  size_t end_j;
  size_t start_j;
  type E_lefts;
  size_t mc;
  size_t i;
  size_t kc;
  size_t k;
  size_t stride2;
  size_t stride1;
  double *Mpointer;
  storage_type storageM;
  size_t Eb;
  size_t Mb;
  size_t K;
  size_t M;
  pointer M_diagonal_block;
  value_type *E_right;
  value_type *E_left;
  aligned_allocator<double,_64UL> allocatorM;
  aligned_allocator<double,_64UL> allocatorE;
  pointer in_stack_fffffffffffffe48;
  matrix<double,_remora::column_major,_remora::cpu_tag> *in_stack_fffffffffffffe50;
  aligned_allocator<double,_64UL> *local_1a0;
  const_void_pointer in_stack_fffffffffffffe68;
  size_type in_stack_fffffffffffffe70;
  aligned_allocator<double,_64UL> *in_stack_fffffffffffffe78;
  double *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffe90;
  aligned_allocator<double,_64UL> *local_168;
  undefined1 local_158 [64];
  unsigned_long local_118;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_110;
  ulong local_108;
  ulong local_100;
  undefined8 local_f8;
  undefined1 local_e8 [32];
  unsigned_long local_c8;
  aligned_allocator<double,_64UL> *local_c0;
  ulong local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  ulong local_a0;
  int local_94;
  matrix<double,_remora::column_major,_remora::cpu_tag> *local_90;
  int local_84;
  pointer local_80;
  double *local_78;
  storage_type local_70;
  ulong local_60;
  ulong local_58;
  size_type local_50;
  size_type local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  undefined8 *local_20;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  local_30 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  local_38 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  local_40 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  pmVar2 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
  local_48 = matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar2);
  pmVar2 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
  local_50 = matrix<double,_remora::row_major,_remora::cpu_tag>::size2(pmVar2);
  local_58 = (local_48 + 0x5f) / 0x60;
  local_60 = local_50 + 0x3ff >> 10;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(local_18);
  local_70 = matrix<double,_remora::column_major,_remora::cpu_tag>::raw_storage
                       (in_stack_fffffffffffffe50);
  local_78 = local_70.values;
  local_84 = 1;
  iVar1 = column_major::index_M<unsigned_long,int>(&local_70.leading_dimension,&local_84);
  local_80 = (pointer)(long)iVar1;
  local_94 = 1;
  local_90 = (matrix<double,_remora::column_major,_remora::cpu_tag> *)
             column_major::index_m<unsigned_long,int>(&local_70.leading_dimension,&local_94);
  for (local_a0 = 0; local_a0 < local_60; local_a0 = local_a0 + 1) {
    local_b0 = local_50 + local_a0 * -0x400;
    puVar3 = std::min<unsigned_long>
                       (&syrk_impl<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                         ::EC,&local_b0);
    local_a8 = *puVar3;
    for (local_b8 = 0; local_b8 < local_58; local_b8 = local_b8 + 1) {
      local_c8 = local_48 + local_b8 * -0x60;
      puVar3 = std::min<unsigned_long>
                         (&syrk_impl<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                           ::MC,&local_c8);
      local_c0 = (aligned_allocator<double,_64UL> *)*puVar3;
      subrange<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70);
      pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                (local_e8,local_30);
      local_f8 = 0;
      local_100 = local_b8 + 1;
      for (local_108 = 0; local_108 < local_100; local_108 = local_108 + 1) {
        local_118 = local_48 + local_108 * -0x60;
        puVar3 = std::min<unsigned_long>
                           (&syrk_impl<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                             ::MC,&local_118);
        local_110 = (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)*puVar3;
        subrange<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe70);
        trans<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                  ((matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *)in_stack_fffffffffffffe50);
        pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                  (local_158,local_38);
        if (local_b8 == local_108) {
          for (local_168 = (aligned_allocator<double,_64UL> *)0x0; local_168 != local_c0;
              local_168 = local_168 + 1) {
            for (in_stack_fffffffffffffe90 =
                      (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                       *)0x0; in_stack_fffffffffffffe90 != local_110;
                in_stack_fffffffffffffe90 = in_stack_fffffffffffffe90 + 1) {
              local_40[(long)(in_stack_fffffffffffffe90 + (long)local_168 * 0x60)] = 0.0;
            }
          }
          in_stack_fffffffffffffe48 = (pointer)&DAT_00000060;
          in_stack_fffffffffffffe50 = (matrix<double,_remora::column_major,_remora::cpu_tag> *)0x1;
          mgemm<double,double,remora::bindings::syrk_block_size<double>>
                    (*local_20,local_c0,local_110,local_a8,local_30,local_38,local_40);
          in_stack_fffffffffffffe80 =
               local_78 + local_b8 * 0x60 * (long)local_80 + local_108 * 0x60 * (long)local_90;
          for (in_stack_fffffffffffffe78 = (aligned_allocator<double,_64UL> *)0x0;
              in_stack_fffffffffffffe78 != local_c0;
              in_stack_fffffffffffffe78 = in_stack_fffffffffffffe78 + 1) {
            in_stack_fffffffffffffe70 = 0;
            for (local_1a0 = (aligned_allocator<double,_64UL> *)0x0;
                local_1a0 < in_stack_fffffffffffffe78 + 1; local_1a0 = local_1a0 + 1) {
              lVar4 = (long)in_stack_fffffffffffffe78 * (long)local_80 +
                      (long)local_1a0 * (long)local_90;
              in_stack_fffffffffffffe80[lVar4] =
                   local_40[(long)(local_1a0 + (long)in_stack_fffffffffffffe78 * 0x60)] +
                   in_stack_fffffffffffffe80[lVar4];
            }
          }
        }
        else {
          in_stack_fffffffffffffe48 = local_80;
          in_stack_fffffffffffffe50 = local_90;
          mgemm<double,double,remora::bindings::syrk_block_size<double>>
                    (*local_20,local_c0,local_110,local_a8,local_30,local_38,
                     local_78 + local_b8 * 0x60 * (long)local_80 + local_108 * 0x60 * (long)local_90
                    );
        }
      }
    }
  }
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            ((aligned_allocator<double,_64UL> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             0x10fd77);
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            ((aligned_allocator<double,_64UL> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             0x10fd91);
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            ((aligned_allocator<double,_64UL> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             0x10fdab);
  return;
}

Assistant:

void syrk_impl(
	matrix_expression<E, cpu_tag> const& e,
	matrix_expression<Mat, cpu_tag>& m,
	typename Mat::value_type& alpha,
	Triangular t
){
	typedef typename E::value_type value_type;
	typedef syrk_block_size<value_type> block_size;

	static const std::size_t MC = block_size::lhs_block_size;
	static const std::size_t EC = block_size::rhs_k_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocatorE;
	boost::alignment::aligned_allocator<typename Mat::value_type,block_size::block::align> allocatorM;
	value_type* E_left = allocatorE.allocate(MC * EC);
	value_type* E_right = allocatorE.allocate(MC * EC);
	auto M_diagonal_block = allocatorM.allocate(MC * MC);

	//figure out number of blocks to use
	const std::size_t  M = e().size1();
	const std::size_t  K = e().size2();
	const std::size_t Mb = (M+MC-1) / MC;//we split m in Mb x Mb blocks
	const std::size_t Eb = (K+EC-1) / EC;//we split B in Mb x Eb blocks

	//get access to raw storage of M
	auto storageM = m().raw_storage();
	auto Mpointer = storageM.values;
	const std::size_t stride1 = Mat::orientation::index_M(storageM.leading_dimension,1);
	const std::size_t stride2 = Mat::orientation::index_m(storageM.leading_dimension,1);

	for (std::size_t k = 0; k < Eb; ++k) {//column blocks of E
		std::size_t kc = std::min(EC, K - k * EC);
		for (std::size_t i = 0; i < Mb; ++i){//row-blocks of M
			std::size_t mc = std::min(MC, M - i * MC);
			//load block of the left E into memory
			auto E_lefts = subrange(e, i * MC, i * MC + mc, k*EC, k*EC + kc );
			pack_A_dense(E_lefts, E_left, block_size());

			std::size_t start_j = Triangular::is_upper? i : 0;
			std::size_t end_j = Triangular::is_upper? Mb : i+1;
			for(std::size_t j = start_j; j < end_j; ++j){//traverse over the blocks that are to be computed
				std::size_t mc2 = std::min(MC, M - j * MC);
				//load block of the right E into memory
				auto E_rights = subrange(e, j * MC, j * MC + mc2, k*EC, k*EC + kc );
				auto E_rights_trans = trans(E_rights);
				pack_B_dense(E_rights_trans, E_right, block_size());

				if(i==j){//diagonal block: we have to ensure that we only access elements on the diagonal
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						for(std::size_t j0 = 0; j0 != mc2; ++j0){
							M_diagonal_block[i0*MC+j0] = 0.0;
						}
					}
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						M_diagonal_block, MC, 1, block_size()
					);
					auto M_diagonal = Mpointer + i * MC * stride1 + j * MC * stride2;
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						std::size_t start_j0 = Triangular::is_upper? i0 : 0;
						std::size_t end_j0 = Triangular::is_upper? mc2 : i0+1;
						for(std::size_t j0 = start_j0; j0 < end_j0; ++j0){
							M_diagonal[i0*stride1+j0*stride2] += M_diagonal_block[i0*MC+j0];
						}
					}
				}else{
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						&Mpointer[i*MC * stride1 + j*MC * stride2], stride1, stride2, block_size()
					);
				}
			}
		}
	}
	//free storage
	allocatorE.deallocate(E_left,MC * EC);
	allocatorE.deallocate(E_right,MC * EC);
	allocatorM.deallocate(M_diagonal_block, MC * MC);
}